

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::ProducerIPCClientImpl::UpdateDataSource
          (ProducerIPCClientImpl *this,DataSourceDescriptor *descriptor)

{
  bitset<2UL> bVar1;
  DataSourceDescriptor *this_00;
  Deferred<perfetto::protos::gen::UpdateDataSourceResponse> local_e8;
  anon_class_1_0_00000001 local_c1;
  function<void_(perfetto::ipc::AsyncResult<perfetto::protos::gen::UpdateDataSourceResponse>)>
  local_c0;
  function<void_(perfetto::ipc::AsyncResult<perfetto::protos::gen::UpdateDataSourceResponse>)>
  local_a0;
  undefined1 local_80 [8];
  Deferred<perfetto::protos::gen::UpdateDataSourceResponse> async_response;
  undefined1 local_50 [8];
  UpdateDataSourceRequest req;
  DataSourceDescriptor *descriptor_local;
  ProducerIPCClientImpl *this_local;
  
  req._has_field_.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)(_Base_bitset<1UL>)descriptor;
  if ((this->connected_ & 1U) == 0) {
    perfetto::base::ignore_result<char[60]>
              ((char (*) [60])"Cannot UpdateDataSource(), not connected to tracing service");
  }
  protos::gen::UpdateDataSourceRequest::UpdateDataSourceRequest((UpdateDataSourceRequest *)local_50)
  ;
  bVar1 = req._has_field_;
  this_00 = protos::gen::UpdateDataSourceRequest::mutable_data_source_descriptor
                      ((UpdateDataSourceRequest *)local_50);
  protos::gen::DataSourceDescriptor::operator=
            (this_00,(DataSourceDescriptor *)bVar1.super__Base_bitset<1UL>._M_w);
  std::function<void_(perfetto::ipc::AsyncResult<perfetto::protos::gen::UpdateDataSourceResponse>)>
  ::function(&local_a0,(nullptr_t)0x0);
  ipc::Deferred<perfetto::protos::gen::UpdateDataSourceResponse>::Deferred
            ((Deferred<perfetto::protos::gen::UpdateDataSourceResponse> *)local_80,&local_a0);
  std::function<void_(perfetto::ipc::AsyncResult<perfetto::protos::gen::UpdateDataSourceResponse>)>
  ::~function(&local_a0);
  ::std::function<void(perfetto::ipc::AsyncResult<perfetto::protos::gen::UpdateDataSourceResponse>)>
  ::
  function<perfetto::ProducerIPCClientImpl::UpdateDataSource(perfetto::protos::gen::DataSourceDescriptor_const&)::__0,void>
            ((function<void(perfetto::ipc::AsyncResult<perfetto::protos::gen::UpdateDataSourceResponse>)>
              *)&local_c0,&local_c1);
  ipc::Deferred<perfetto::protos::gen::UpdateDataSourceResponse>::Bind
            ((Deferred<perfetto::protos::gen::UpdateDataSourceResponse> *)local_80,&local_c0);
  std::function<void_(perfetto::ipc::AsyncResult<perfetto::protos::gen::UpdateDataSourceResponse>)>
  ::~function(&local_c0);
  ipc::Deferred<perfetto::protos::gen::UpdateDataSourceResponse>::Deferred
            (&local_e8,(Deferred<perfetto::protos::gen::UpdateDataSourceResponse> *)local_80);
  protos::gen::ProducerPortProxy::UpdateDataSource
            (&this->producer_port_,(UpdateDataSourceRequest *)local_50,&local_e8,-1);
  ipc::Deferred<perfetto::protos::gen::UpdateDataSourceResponse>::~Deferred(&local_e8);
  ipc::Deferred<perfetto::protos::gen::UpdateDataSourceResponse>::~Deferred
            ((Deferred<perfetto::protos::gen::UpdateDataSourceResponse> *)local_80);
  protos::gen::UpdateDataSourceRequest::~UpdateDataSourceRequest
            ((UpdateDataSourceRequest *)local_50);
  return;
}

Assistant:

void ProducerIPCClientImpl::UpdateDataSource(
    const DataSourceDescriptor& descriptor) {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  if (!connected_) {
    PERFETTO_DLOG(
        "Cannot UpdateDataSource(), not connected to tracing service");
  }
  protos::gen::UpdateDataSourceRequest req;
  *req.mutable_data_source_descriptor() = descriptor;
  ipc::Deferred<protos::gen::UpdateDataSourceResponse> async_response;
  async_response.Bind(
      [](ipc::AsyncResult<protos::gen::UpdateDataSourceResponse> response) {
        if (!response)
          PERFETTO_DLOG("UpdateDataSource() failed: connection reset");
      });
  producer_port_.UpdateDataSource(req, std::move(async_response));
}